

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minigzip.c
# Opt level: O2

void file_uncompress(char *file)

{
  int iVar1;
  size_t sVar2;
  gzFile in;
  FILE *out;
  ulong uVar3;
  char *__name;
  char *__filename;
  char buf [1024];
  
  __filename = buf;
  sVar2 = strlen(file);
  uVar3 = sVar2 & 0xffffffff;
  if (0x3fc < uVar3) {
    fprintf(_stderr,"%s: filename too long\n",prog);
    goto LAB_00101610;
  }
  snprintf(buf,0x400,"%s",file);
  if ((uint)sVar2 < 4) {
LAB_00101541:
    snprintf(buf + uVar3,0x400 - uVar3,"%s",".gz");
    __name = buf;
    __filename = file;
  }
  else {
    iVar1 = strcmp(file + (uVar3 - 3),".gz");
    if (iVar1 != 0) goto LAB_00101541;
    buf[(uint)sVar2 - 3] = '\0';
    __name = file;
  }
  in = (gzFile)gzopen64(__name,"rb");
  if (in == (gzFile)0x0) {
    fprintf(_stderr,"%s: can\'t gzopen %s\n",prog,__name);
  }
  else {
    out = fopen64(__filename,"wb");
    if (out != (FILE *)0x0) {
      gz_uncompress(in,(FILE *)out);
      unlink(__name);
      return;
    }
    perror(file);
  }
LAB_00101610:
  exit(1);
}

Assistant:

void file_uncompress(file)
    char  *file;
{
    local char buf[MAX_NAME_LEN];
    char *infile, *outfile;
    FILE  *out;
    gzFile in;
    unsigned len = strlen(file);

    if (len + strlen(GZ_SUFFIX) >= sizeof(buf)) {
        fprintf(stderr, "%s: filename too long\n", prog);
        exit(1);
    }

#if !defined(NO_snprintf) && !defined(NO_vsnprintf)
    snprintf(buf, sizeof(buf), "%s", file);
#else
    strcpy(buf, file);
#endif

    if (len > SUFFIX_LEN && strcmp(file+len-SUFFIX_LEN, GZ_SUFFIX) == 0) {
        infile = file;
        outfile = buf;
        outfile[len-3] = '\0';
    } else {
        outfile = file;
        infile = buf;
#if !defined(NO_snprintf) && !defined(NO_vsnprintf)
        snprintf(buf + len, sizeof(buf) - len, "%s", GZ_SUFFIX);
#else
        strcat(infile, GZ_SUFFIX);
#endif
    }
    in = gzopen(infile, "rb");
    if (in == NULL) {
        fprintf(stderr, "%s: can't gzopen %s\n", prog, infile);
        exit(1);
    }
    out = fopen(outfile, "wb");
    if (out == NULL) {
        perror(file);
        exit(1);
    }

    gz_uncompress(in, out);

    unlink(infile);
}